

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcProductDefinitionShape::IfcProductDefinitionShape
          (IfcProductDefinitionShape *this)

{
  IfcProductDefinitionShape *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcProductRepresentation).field_0x88,
             "IfcProductDefinitionShape");
  IfcProductRepresentation::IfcProductRepresentation
            (&this->super_IfcProductRepresentation,&PTR_construction_vtable_24__00fa7208);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductDefinitionShape,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductDefinitionShape,_0UL> *)
             &(this->super_IfcProductRepresentation).field_0x78,
             &PTR_construction_vtable_24__00fa7228);
  (this->super_IfcProductRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>._vptr_ObjectHelper =
       (_func_int **)0xfa71a0;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x88 = 0xfa71f0;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x78 = 0xfa71c8;
  return;
}

Assistant:

IfcProductDefinitionShape() : Object("IfcProductDefinitionShape") {}